

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

CBComment * __thiscall asmjit::CodeBuilder::newCommentNode(CodeBuilder *this,char *s,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  CBComment *pCVar2;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t allocatedSize;
  char *in_stack_00000340;
  int in_stack_0000034c;
  char *in_stack_00000350;
  size_t local_90;
  char *local_88;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  ZoneHeap *in_stack_ffffffffffffffe8;
  
  local_88 = in_RSI;
  if (in_RSI != (char *)0x0) {
    local_90 = in_RDX;
    if (in_RDX == 0xffffffffffffffff) {
      local_90 = strlen(in_RSI);
    }
    if (local_90 != 0) {
      iVar1 = Zone::dup((Zone *)(in_RDI + 0x98),(int)in_RSI);
      local_88 = (char *)CONCAT44(extraout_var,iVar1);
      if (local_88 == (char *)0x0) {
        return (CBComment *)0x0;
      }
    }
  }
  if (*(long *)(in_RDI + 0xd8) != 0) {
    pCVar2 = (CBComment *)
             ZoneHeap::_alloc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    (pCVar2->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar2->super_CBNode)._next = (CBNode *)0x0;
    (pCVar2->super_CBNode)._type = '\a';
    (pCVar2->super_CBNode)._opCount = '\0';
    (pCVar2->super_CBNode)._flags = (uint16_t)*(undefined4 *)(in_RDI + 0x184);
    (pCVar2->super_CBNode)._position = *(uint32_t *)(in_RDI + 0x180);
    (pCVar2->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar2->super_CBNode)._passData = (void *)0x0;
    (pCVar2->super_CBNode)._flags = (pCVar2->super_CBNode)._flags | 0xc;
    (pCVar2->super_CBNode)._inlineComment = local_88;
    return pCVar2;
  }
  DebugUtils::assertionFailed(in_stack_00000350,in_stack_0000034c,in_stack_00000340);
}

Assistant:

CBComment* CodeBuilder::newCommentNode(const char* s, size_t len) noexcept {
  if (s) {
    if (len == Globals::kInvalidIndex) len = ::strlen(s);
    if (len > 0) {
      s = static_cast<char*>(_cbDataZone.dup(s, len, true));
      if (!s) return nullptr;
    }
  }

  return newNodeT<CBComment>(s);
}